

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O2

bool __thiscall BamTools::FilterTool::FilterToolPrivate::Run(FilterToolPrivate *this)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  string *psVar4;
  istream *piVar5;
  ostream *poVar6;
  char *pcVar7;
  FilterSettings *pFVar8;
  BamMultiReader reader;
  BamWriter writer;
  BamRegion local_278;
  CompressionMode local_25c;
  string headerText;
  IndexType local_234;
  BamAlignment al;
  
  pFVar8 = this->m_settings;
  if ((pFVar8->HasInput == false) && (pFVar8->HasInputFilelist == false)) {
    psVar4 = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pFVar8->InputFiles,psVar4);
    pFVar8 = this->m_settings;
  }
  if (pFVar8->HasInputFilelist == true) {
    std::ifstream::ifstream(&al,(pFVar8->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "bamtools filter ERROR: could not open input BAM file list... Aborting."
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      headerText._M_dataplus._M_p = (pointer)&headerText.field_2;
      headerText._M_string_length = 0;
      headerText.field_2._M_local_buf[0] = '\0';
      while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&al,(string *)&headerText),
            ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&headerText);
      }
      std::__cxx11::string::~string((string *)&headerText);
    }
    std::ifstream::~ifstream(&al);
    if (cVar1 == '\0') {
      return false;
    }
  }
  bVar2 = SetupFilters(this);
  if (!bVar2) {
    return false;
  }
  BamMultiReader::BamMultiReader(&reader);
  bVar2 = BamMultiReader::Open(&reader,&this->m_settings->InputFiles);
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "bamtools filter ERROR: could not open input files for reading.");
    std::endl<char,std::char_traits<char>>(poVar6);
    bVar2 = false;
    goto LAB_00169b9e;
  }
  BamMultiReader::GetHeaderText_abi_cxx11_(&headerText,&reader);
  BamMultiReader::GetReferenceData((RefVector *)&al,&reader);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)filterToolReferences,
             (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&al);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)&al);
  pFVar8 = this->m_settings;
  psVar4 = Options::StandardOut_abi_cxx11_();
  _Var3 = std::operator==(&pFVar8->OutputFilename,psVar4);
  local_25c = Compressed;
  if (_Var3) {
    local_25c = this->m_settings->IsForceCompression ^ Uncompressed;
  }
  BamWriter::BamWriter(&writer);
  BamWriter::SetCompressionMode(&writer,&local_25c);
  bVar2 = BamWriter::Open(&writer,&this->m_settings->OutputFilename,&headerText,
                          (RefVector *)filterToolReferences);
  if (bVar2) {
    BamAlignment::BamAlignment(&al);
    if (this->m_settings->HasRegion == false) {
      while (bVar2 = BamMultiReader::GetNextAlignment(&reader,&al), bVar2) {
        bVar2 = FilterEngine<BamTools::BamAlignmentChecker>::
                evaluateFilterRules<BamTools::BamAlignment>(&this->m_filterEngine,&al);
        if (bVar2) {
          BamWriter::SaveAlignment(&writer,&al);
        }
      }
LAB_00169b6c:
      BamMultiReader::Close(&reader);
      bVar2 = true;
      BamWriter::Close(&writer);
    }
    else {
      local_278.LeftRefID = -1;
      local_278.LeftPosition = -1;
      local_278.RightRefID = -1;
      local_278.RightPosition = -1;
      bVar2 = Utilities::ParseRegionString(&this->m_settings->Region,&reader,&local_278);
      if (bVar2) {
        local_234 = STANDARD;
        BamMultiReader::LocateIndexes(&reader,&local_234);
        bVar2 = BamMultiReader::HasIndexes(&reader);
        if (bVar2) {
          bVar2 = BamMultiReader::SetRegion
                            (&reader,&local_278.LeftRefID,&local_278.LeftPosition,
                             &local_278.RightRefID,&local_278.RightPosition);
          if (!bVar2) {
            pcVar7 = 
            "bamtools filter ERROR: set region failed. Check that REGION describes a valid range";
            goto LAB_00169ae4;
          }
          while (bVar2 = BamMultiReader::GetNextAlignment(&reader,&al), bVar2) {
            bVar2 = FilterEngine<BamTools::BamAlignmentChecker>::
                    evaluateFilterRules<BamTools::BamAlignment>(&this->m_filterEngine,&al);
            if (bVar2) {
              BamWriter::SaveAlignment(&writer,&al);
            }
          }
        }
        else {
          while (bVar2 = BamMultiReader::GetNextAlignment(&reader,&al), bVar2) {
            if ((((local_278.LeftRefID <= al.RefID) &&
                 (local_278.LeftPosition <= al.Length + al.Position)) &&
                (al.RefID <= local_278.RightRefID)) &&
               ((al.Position <= local_278.RightPosition &&
                (bVar2 = FilterEngine<BamTools::BamAlignmentChecker>::
                         evaluateFilterRules<BamTools::BamAlignment>(&this->m_filterEngine,&al),
                bVar2)))) {
              BamWriter::SaveAlignment(&writer,&al);
            }
          }
        }
        goto LAB_00169b6c;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "bamtools filter ERROR: could not parse REGION: ");
      poVar6 = std::operator<<(poVar6,(string *)&this->m_settings->Region);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar7 = 
      "Check that REGION is in valid format (see documentation) and that the coordinates are valid";
LAB_00169ae4:
      poVar6 = std::operator<<((ostream *)&std::cerr,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
      BamMultiReader::Close(&reader);
      bVar2 = false;
    }
    BamAlignment::~BamAlignment(&al);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"bamtools filter ERROR: could not open ");
    poVar6 = std::operator<<(poVar6,(string *)&this->m_settings->OutputFilename);
    poVar6 = std::operator<<(poVar6," for writing.");
    std::endl<char,std::char_traits<char>>(poVar6);
    BamMultiReader::Close(&reader);
    bVar2 = false;
  }
  BamWriter::~BamWriter(&writer);
  std::__cxx11::string::~string((string *)&headerText);
LAB_00169b9e:
  BamMultiReader::~BamMultiReader(&reader);
  return bVar2;
}

Assistant:

bool FilterTool::FilterToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools filter ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // initialize defined properties & user-specified filters
    // quit if failed
    if (!SetupFilters()) return false;

    // open reader without index
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools filter ERROR: could not open input files for reading." << std::endl;
        return false;
    }

    // retrieve reader header & reference data
    const std::string headerText = reader.GetHeaderText();
    filterToolReferences = reader.GetReferenceData();

    // determine compression mode for BamWriter
    bool writeUncompressed =
        (m_settings->OutputFilename == Options::StandardOut() && !m_settings->IsForceCompression);
    BamWriter::CompressionMode compressionMode = BamWriter::Compressed;
    if (writeUncompressed) compressionMode = BamWriter::Uncompressed;

    // open BamWriter
    BamWriter writer;
    writer.SetCompressionMode(compressionMode);
    if (!writer.Open(m_settings->OutputFilename, headerText, filterToolReferences)) {
        std::cerr << "bamtools filter ERROR: could not open " << m_settings->OutputFilename
                  << " for writing." << std::endl;
        reader.Close();
        return false;
    }

    // if no region specified, filter entire file
    BamAlignment al;
    if (!m_settings->HasRegion) {
        while (reader.GetNextAlignment(al)) {
            if (CheckAlignment(al)) writer.SaveAlignment(al);
        }
    }

    // otherwise attempt to use region as constraint
    else {

        // if region string parses OK
        BamRegion region;
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            // attempt to find index files
            reader.LocateIndexes();

            // if index data available for all BAM files, we can use SetRegion
            if (reader.HasIndexes()) {

                // attempt to use SetRegion(), if failed report error
                if (!reader.SetRegion(region.LeftRefID, region.LeftPosition, region.RightRefID,
                                      region.RightPosition)) {
                    std::cerr << "bamtools filter ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }

                // everything checks out, just iterate through specified region, filtering alignments
                while (reader.GetNextAlignment(al))
                    if (CheckAlignment(al)) writer.SaveAlignment(al);
            }

            // no index data available, we have to iterate through until we
            // find overlapping alignments
            else {
                while (reader.GetNextAlignment(al)) {
                    if ((al.RefID >= region.LeftRefID) &&
                        ((al.Position + al.Length) >= region.LeftPosition) &&
                        (al.RefID <= region.RightRefID) && (al.Position <= region.RightPosition)) {
                        if (CheckAlignment(al)) writer.SaveAlignment(al);
                    }
                }
            }
        }

        // error parsing REGION string
        else {
            std::cerr << "bamtools filter ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // clean up & exit
    reader.Close();
    writer.Close();
    return true;
}